

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,int_const&,int_const&,int_const&>
          (pybind11 *this,int *args_,int *args__1,int *args__2)

{
  undefined8 uVar1;
  runtime_error *this_00;
  long *plVar2;
  object *poVar3;
  long *plVar4;
  long lVar5;
  array<pybind11::object,_3UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  object local_e8 [3];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [3];
  
  poVar3 = local_e8;
  local_e8[0].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args_);
  local_e8[1].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__1);
  local_e8[2].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__2);
  lVar5 = 0;
  do {
    if (*(long *)poVar3 == 0) {
      type_id<int_const&>();
      type_id<int_const&>();
      type_id<int_const&>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_90 - lVar5));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_d0 == plVar4) {
        local_c0 = *plVar4;
        lStack_b8 = plVar2[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar4;
      }
      local_c8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_d0);
      *(undefined ***)this_00 = &PTR__runtime_error_00152228;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar5 = lVar5 + -0x20;
    poVar3 = (object *)((long *)poVar3 + 1);
  } while (lVar5 != -0x60);
  tuple::tuple((tuple *)this,3);
  lVar5 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_e8[0].super_handle.m_ptr + lVar5);
    *(undefined8 *)((long)&local_e8[0].super_handle.m_ptr + lVar5) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const int &, const int &, const int &>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar5) = uVar1;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  lVar5 = 0x10;
  do {
    object::~object((object *)((long)&local_e8[0].super_handle.m_ptr + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}